

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O0

void __thiscall
pg::Oink::getBottomSCC(Oink *this,vector<int,_std::allocator<int>_> *scc,bool nonempty)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  undefined1 local_30 [24];
  int i;
  bool nonempty_local;
  vector<int,_std::allocator<int>_> *scc_local;
  Oink *this_local;
  
  local_30[0x17] = nonempty;
  _i = scc;
  scc_local = (vector<int,_std::allocator<int>_> *)this;
  std::vector<int,_std::allocator<int>_>::clear(scc);
  local_30._16_4_ = 0;
  while( true ) {
    lVar3 = (long)(int)local_30._16_4_;
    lVar2 = Game::nodecount(this->game);
    if (lVar2 <= lVar3) {
      return;
    }
    bitset::operator[]((bitset *)local_30,(size_t)&this->disabled);
    bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_30);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    local_30._16_4_ = local_30._16_4_ + 1;
  }
  tarjan(this,local_30._16_4_,_i,(bool)(local_30[0x17] & 1));
  return;
}

Assistant:

void
Oink::getBottomSCC(std::vector<int> &scc, bool nonempty)
{
    scc.clear();
    for (int i=0; i<game->nodecount(); i++) {
        if (!disabled[i]) {
            tarjan(i, scc, nonempty);
            return;
        }
    }
}